

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::removeRows(SPxLPBase<double> *this,int *nums,int n,int *perm)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  DataArray<int> p;
  DataArray<int> DStack_38;
  
  if (perm != (int *)0x0) {
    uVar1 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    while (0 < (int)uVar1) {
      uVar1 = uVar1 - 1;
      perm[uVar1] = uVar1;
    }
    lVar2 = (long)n;
    while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
      perm[nums[lVar2]] = -1;
    }
    (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x11])(this,perm);
    return;
  }
  DataArray<int>::DataArray
            (&DStack_38,(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,0,1.2)
  ;
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x13])
            (this,nums,(ulong)(uint)n,DStack_38.data);
  DataArray<int>::~DataArray(&DStack_38);
  return;
}

Assistant:

virtual void removeRows(int nums[], int n, int perm[] = nullptr)
   {

      if(perm == nullptr)
      {
         DataArray < int > p(nRows());
         removeRows(nums, n, p.get_ptr());
         return;
      }

      for(int i = nRows() - 1; i >= 0; --i)
         perm[i] = i;

      while(n--)
         perm[nums[n]] = -1;

      removeRows(perm);
   }